

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall cmComputeTargetDepends::CollectTargets(cmComputeTargetDepends *this)

{
  pointer *pppcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  iterator __position;
  pointer ppcVar4;
  mapped_type_conflict *pmVar5;
  pointer ppcVar6;
  cmGeneratorTarget *gt;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  cmGeneratorTarget *local_68;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_60;
  cmGlobalGenerator *local_48;
  ulong local_40;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *local_38;
  
  local_48 = this->GlobalGenerator;
  ppcVar4 = (local_48->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_48->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar4) {
    local_38 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
               &this->Targets;
    local_40 = 0;
    do {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&local_60,&ppcVar4[local_40]->GeneratorTargets);
      for (ppcVar6 = local_60.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppcVar6 !=
          local_60.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
        local_68 = *ppcVar6;
        ppcVar2 = (this->Targets).
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppcVar3 = (this->Targets).
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pmVar5 = std::
                 map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                 ::operator[](&this->TargetIndex,&local_68);
        *pmVar5 = (mapped_type_conflict)((ulong)((long)ppcVar3 - (long)ppcVar2) >> 3);
        __position._M_current =
             (this->Targets).
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->Targets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
          _M_realloc_insert<cmGeneratorTarget_const*const&>(local_38,__position,&local_68);
        }
        else {
          *__position._M_current = local_68;
          pppcVar1 = &(this->Targets).
                      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      if (local_60.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_40 = (ulong)((int)local_40 + 1);
      ppcVar4 = (local_48->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (local_40 <
             (ulong)((long)(local_48->LocalGenerators).
                           super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar4 >> 3));
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargets()
{
  // Collect all targets from all generators.
  std::vector<cmLocalGenerator*> const& lgens =
    this->GlobalGenerator->GetLocalGenerators();
  for (unsigned int i = 0; i < lgens.size(); ++i) {
    const std::vector<cmGeneratorTarget*> targets =
      lgens[i]->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::const_iterator ti = targets.begin();
         ti != targets.end(); ++ti) {
      cmGeneratorTarget* gt = *ti;
      int index = static_cast<int>(this->Targets.size());
      this->TargetIndex[gt] = index;
      this->Targets.push_back(gt);
    }
  }
}